

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

void Abc_NtkDetectClassesTest(Abc_Ntk_t *pNtk,int fSeq,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  Vec_Int_t *__ptr;
  void *__ptr_00;
  int iVar2;
  Vec_Wec_t *pVVar3;
  long lVar4;
  long lVar5;
  int level;
  ulong uVar6;
  ulong uVar7;
  timespec ts;
  timespec local_48;
  Vec_Wec_t *local_38;
  
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (fSeq != 0) {
    Abc_NtkFrameExtend(pNtk);
  }
  pVVar3 = Abc_NtkDetectFinClasses(pNtk,fVerbose);
  uVar1 = pVVar3->nSize;
  uVar7 = (ulong)(int)uVar1;
  if ((long)uVar7 < 1) {
    uVar6 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = (ulong)(((int)uVar6 + *(int *)((long)&pVVar3->pArray->nSize + lVar5)) - 1);
      lVar5 = lVar5 + 0x10;
    } while (uVar7 << 4 != lVar5);
  }
  printf("Computed %d equivalence classes with %d item pairs.  ",(ulong)uVar1,uVar6);
  level = 3;
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  __ptr = pVVar3->pArray;
  local_38 = pVVar3;
  if ((fVeryVerbose != 0) && (0 < (int)uVar1)) {
    uVar6 = 0;
    do {
      if (__ptr[uVar6].nSize != 1) {
        printf(" %4d : {",uVar6 & 0xffffffff);
        if (0 < __ptr[uVar6].nSize) {
          lVar4 = 0;
          do {
            printf(" %d",(ulong)(uint)__ptr[uVar6].pArray[lVar4]);
            lVar4 = lVar4 + 1;
          } while (lVar4 < __ptr[uVar6].nSize);
        }
        puts(" }");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar7);
  }
  pVVar3 = local_38;
  iVar2 = local_38->nCap;
  if ((long)iVar2 < 1) {
    if (__ptr == (Vec_Int_t *)0x0) goto LAB_002b5cfe;
  }
  else {
    lVar4 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray + lVar4);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar4);
  }
  free(__ptr);
LAB_002b5cfe:
  free(pVVar3);
  return;
}

Assistant:

void Abc_NtkDetectClassesTest( Abc_Ntk_t * pNtk, int fSeq, int fVerbose, int fVeryVerbose )
{
    Vec_Wec_t * vResult;
    abctime clk = Abc_Clock();
    if ( fSeq ) 
        Abc_NtkFrameExtend( pNtk );
    vResult = Abc_NtkDetectFinClasses( pNtk, fVerbose );
    printf( "Computed %d equivalence classes with %d item pairs.  ", Vec_WecSize(vResult), Abc_NtkFinCountPairs(vResult) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        Vec_WecPrint( vResult, 1 );
//    if ( fVerbose )
//        Abc_NtkPrintFinResults( vResult );
    Vec_WecFree( vResult );
}